

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  UdpTools *this;
  int iVar1;
  char *pcVar2;
  string message;
  string port;
  string ifaceName;
  string sendAddress;
  allocator<char> local_111;
  long *local_110;
  int local_108;
  long local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  if (argc < 3) {
    printf("\nUsage: %s <address> <port>\n\nExample: %s ff02::5:6 12345\n\n",*argv);
    return 1;
  }
  if (argc - 5U < 0xfffffffe) {
    puts("Usage: send address port. Example send ff02::5:6 12345");
    puts(
        "Usage (need be root): send iface-name address port. Example sudo send eth0 ff02::5:6 12345"
        );
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,argv[1],(allocator<char> *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,argv[2],(allocator<char> *)&local_d0);
  local_c8 = 0;
  local_c0 = 0;
  pcVar2 = argv[1];
  local_d0 = &local_c0;
  if (argc == 3) {
    if ((pcVar2 != (char *)0x0) && (argv[2] != (char *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar2,&local_111);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_110);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,argv[2],&local_111);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_110);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      this = (UdpTools *)operator_new(0x30);
      UdpTools::UdpTools(this);
LAB_001025dc:
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"AreYouThere?","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_b0,local_a8 + (long)local_b0);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_f0,local_e8 + (long)local_f0);
      UdpTools::SendUDPDatagram(this,true,&local_70,&local_90,(char *)local_110,local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      iVar1 = 0;
      goto LAB_001026e0;
    }
    pcVar2 = "Usage: listen address port. Example receive ff02::5:6 12345";
  }
  else {
    if (((pcVar2 != (char *)0x0) && (argv[2] != (char *)0x0)) && (argv[3] != (char *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar2,&local_111);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,argv[2],&local_111);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_110);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,argv[3],&local_111);
      std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_110);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      this = (UdpTools *)operator_new(0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_d0,local_d0 + local_c8);
      UdpTools::UdpTools(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001025dc;
    }
    pcVar2 = "Usage: listen iface-name address port. Example receive eth0 ff02::5:6 12345";
  }
  puts(pcVar2);
  iVar1 = -1;
LAB_001026e0:
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc < 3) {
		printf("\nUsage: %s <address> <port>\n\nExample: %s ff02::5:6 12345\n\n", argv[0], argv[0]);
		return 1;
	}

	if(argc != 3 && argc != 4)
	{
		printf("Usage: send address port. Example send ff02::5:6 12345\n");
		printf("Usage (need be root): send iface-name address port. Example sudo send eth0 ff02::5:6 12345\n");
		return -1;
	}

	std::string sendAddress = std::string(argv[1]);
	std::string port = std::string(argv[2]);
	std::string ifaceName;
	UdpTools* p_udpSender;

	if(argc == 3)
	{
		if(argv[1] == NULL || argv[2] == NULL)
		{
			printf("Usage: listen address port. Example receive ff02::5:6 12345\n");
			return -1;
		}
		sendAddress = std::string(argv[1]);
		port = std::string(argv[2]);
		p_udpSender = new UdpTools();

	}

	if(argc == 4)
	{
		if(argv[1] == NULL || argv[2] == NULL || argv[3] == NULL)
		{
			printf("Usage: listen iface-name address port. Example receive eth0 ff02::5:6 12345\n");
			return -1;
		}
		ifaceName = std::string(argv[1]);
		sendAddress = std::string(argv[2]);
		port = std::string(argv[3]);
		p_udpSender = new UdpTools(ifaceName);
	}

	std::string message = "AreYouThere?";
	p_udpSender->SendUDPDatagram(true, sendAddress, port, message.c_str(), message.length());

}